

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

bool __thiscall
Js::DynamicProfileInfo::Serialize<Js::BufferWriter>(DynamicProfileInfo *this,BufferWriter *writer)

{
  Type TVar1;
  ValueType *pVVar2;
  LdLenInfo *pLVar3;
  LdElemInfo *pLVar4;
  StElemInfo *pSVar5;
  ArrayCallSiteInfo *pAVar6;
  FldInfo *pFVar7;
  CallSiteInfo *pCVar8;
  ImplicitCallFlags *pIVar9;
  BVFixed *this_00;
  code *pcVar10;
  bool bVar11;
  uint32 uVar12;
  BVIndex BVar13;
  FunctionBody *this_01;
  undefined4 *puVar14;
  ValueType *local_c0;
  LdLenInfo *local_b8;
  LdElemInfo *local_b0;
  StElemInfo *local_a8;
  ArrayCallSiteInfo *local_a0;
  FldInfo *local_98;
  ValueType *local_90;
  CallSiteInfo *local_88;
  CallSiteInfo *local_80;
  ValueType *local_78;
  ValueType *local_70;
  ValueType *local_68;
  ImplicitCallFlags *local_60;
  Type local_54;
  uint32 local_50;
  uint32 local_4c;
  Type local_46;
  Type local_44;
  Type local_42;
  Type local_40;
  Type local_3e;
  Type local_3c;
  unsigned_short local_3a;
  Type local_38;
  Type local_36;
  Type local_34;
  ushort local_32 [4];
  ArgSlot paramInfoCount;
  
  BufferWriter::Log((BufferWriter *)this,this);
  this_01 = GetFunctionBody(this);
  TVar1 = (this_01->super_ParseableFunctionInfo).m_inParamCount;
  local_32[0] = TVar1 - 1;
  if (TVar1 == 0) {
    local_32[0] = 0;
  }
  if ((this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar11) {
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar14 = 0;
  }
  local_54 = ((this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
             functionId;
  bVar11 = BufferWriter::WriteArray<unsigned_int_const>(writer,&local_54,1);
  if ((bVar11) &&
     (bVar11 = BufferWriter::WriteArray<unsigned_short_const>(writer,local_32,1), bVar11)) {
    pVVar2 = (this->parameterInfo).ptr;
    Memory::Recycler::WBSetBit((char *)&local_c0);
    local_c0 = pVVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_c0);
    bVar11 = BufferWriter::WriteArray<ValueType>(writer,local_c0,(ulong)local_32[0]);
    if (bVar11) {
      local_46 = this_01->profiledLdLenCount;
      bVar11 = BufferWriter::WriteArray<unsigned_short_const>(writer,&local_46,1);
      if (bVar11) {
        pLVar3 = (this->ldLenInfo).ptr;
        Memory::Recycler::WBSetBit((char *)&local_b8);
        local_b8 = pLVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
        bVar11 = BufferWriter::WriteArray<Js::LdLenInfo>
                           (writer,local_b8,(ulong)this_01->profiledLdLenCount);
        if (bVar11) {
          local_44 = this_01->profiledLdElemCount;
          bVar11 = BufferWriter::WriteArray<unsigned_short_const>(writer,&local_44,1);
          if (bVar11) {
            pLVar4 = (this->ldElemInfo).ptr;
            Memory::Recycler::WBSetBit((char *)&local_b0);
            local_b0 = pLVar4;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b0);
            bVar11 = BufferWriter::WriteArray<Js::LdElemInfo>
                               (writer,local_b0,(ulong)this_01->profiledLdElemCount);
            if (bVar11) {
              local_42 = this_01->profiledStElemCount;
              bVar11 = BufferWriter::WriteArray<unsigned_short_const>(writer,&local_42,1);
              if (bVar11) {
                pSVar5 = (this->stElemInfo).ptr;
                Memory::Recycler::WBSetBit((char *)&local_a8);
                local_a8 = pSVar5;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_a8);
                bVar11 = BufferWriter::WriteArray<Js::StElemInfo>
                                   (writer,local_a8,(ulong)this_01->profiledStElemCount);
                if (bVar11) {
                  local_40 = this_01->profiledArrayCallSiteCount;
                  bVar11 = BufferWriter::WriteArray<unsigned_short_const>(writer,&local_40,1);
                  if (bVar11) {
                    pAVar6 = (this->arrayCallSiteInfo).ptr;
                    Memory::Recycler::WBSetBit((char *)&local_a0);
                    local_a0 = pAVar6;
                    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_a0);
                    bVar11 = BufferWriter::WriteArray<Js::ArrayCallSiteInfo>
                                       (writer,local_a0,(ulong)this_01->profiledArrayCallSiteCount);
                    if (bVar11) {
                      local_50 = FunctionBody::GetCountField(this_01,InlineCacheCount);
                      bVar11 = BufferWriter::WriteArray<unsigned_int_const>(writer,&local_50,1);
                      if (bVar11) {
                        pFVar7 = (this->fldInfo).ptr;
                        Memory::Recycler::WBSetBit((char *)&local_98);
                        local_98 = pFVar7;
                        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_98);
                        uVar12 = FunctionBody::GetCountField(this_01,InlineCacheCount);
                        bVar11 = BufferWriter::WriteArray<Js::FldInfo>
                                           (writer,local_98,(ulong)uVar12);
                        if (bVar11) {
                          local_3e = this_01->profiledSlotCount;
                          bVar11 = BufferWriter::WriteArray<unsigned_short_const>
                                             (writer,&local_3e,1);
                          if (bVar11) {
                            pVVar2 = (this->slotInfo).ptr;
                            Memory::Recycler::WBSetBit((char *)&local_90);
                            local_90 = pVVar2;
                            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_90);
                            bVar11 = BufferWriter::WriteArray<ValueType>
                                               (writer,local_90,(ulong)this_01->profiledSlotCount);
                            if (bVar11) {
                              local_3c = this_01->profiledCallSiteCount;
                              bVar11 = BufferWriter::WriteArray<unsigned_short_const>
                                                 (writer,&local_3c,1);
                              if (bVar11) {
                                pCVar8 = (this->callSiteInfo).ptr;
                                Memory::Recycler::WBSetBit((char *)&local_88);
                                local_88 = pCVar8;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_88);
                                bVar11 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                   (writer,local_88,
                                                    (ulong)this_01->profiledCallSiteCount);
                                if (bVar11) {
                                  uVar12 = FunctionBody::GetCountField
                                                     (this_01,ProfiledCallApplyCallSiteCount);
                                  local_3a = (unsigned_short)uVar12;
                                  bVar11 = BufferWriter::WriteArray<unsigned_short_const>
                                                     (writer,&local_3a,1);
                                  if (bVar11) {
                                    pCVar8 = (this->callApplyTargetInfo).ptr;
                                    Memory::Recycler::WBSetBit((char *)&local_80);
                                    local_80 = pCVar8;
                                    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_80);
                                    uVar12 = FunctionBody::GetCountField
                                                       (this_01,ProfiledCallApplyCallSiteCount);
                                    bVar11 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                       (writer,local_80,(ulong)(uVar12 & 0xffff));
                                    if (bVar11) {
                                      local_38 = this_01->profiledDivOrRemCount;
                                      bVar11 = BufferWriter::WriteArray<unsigned_short_const>
                                                         (writer,&local_38,1);
                                      if (bVar11) {
                                        pVVar2 = (this->divideTypeInfo).ptr;
                                        Memory::Recycler::WBSetBit((char *)&local_78);
                                        local_78 = pVVar2;
                                        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_78)
                                        ;
                                        bVar11 = BufferWriter::WriteArray<ValueType>
                                                           (writer,local_78,
                                                            (ulong)this_01->profiledDivOrRemCount);
                                        if (bVar11) {
                                          local_36 = this_01->profiledSwitchCount;
                                          bVar11 = BufferWriter::WriteArray<unsigned_short_const>
                                                             (writer,&local_36,1);
                                          if (bVar11) {
                                            pVVar2 = (this->switchTypeInfo).ptr;
                                            Memory::Recycler::WBSetBit((char *)&local_70);
                                            local_70 = pVVar2;
                                            Memory::RecyclerWriteBarrierManager::WriteBarrier
                                                      (&local_70);
                                            bVar11 = BufferWriter::WriteArray<ValueType>
                                                               (writer,local_70,
                                                                (ulong)this_01->profiledSwitchCount)
                                            ;
                                            if (bVar11) {
                                              local_34 = this_01->profiledReturnTypeCount;
                                              bVar11 = BufferWriter::
                                                       WriteArray<unsigned_short_const>
                                                                 (writer,&local_34,1);
                                              if (bVar11) {
                                                pVVar2 = (this->returnTypeInfo).ptr;
                                                Memory::Recycler::WBSetBit((char *)&local_68);
                                                local_68 = pVVar2;
                                                Memory::RecyclerWriteBarrierManager::WriteBarrier
                                                          (&local_68);
                                                bVar11 = BufferWriter::WriteArray<ValueType>
                                                                   (writer,local_68,
                                                                    (ulong)this_01->
                                                  profiledReturnTypeCount);
                                                if (bVar11) {
                                                  local_4c = FunctionBody::GetCountField
                                                                       (this_01,LoopCount);
                                                  bVar11 = BufferWriter::
                                                           WriteArray<unsigned_int_const>
                                                                     (writer,&local_4c,1);
                                                  if (bVar11) {
                                                    pIVar9 = (this->loopImplicitCallFlags).ptr;
                                                    Memory::Recycler::WBSetBit((char *)&local_60);
                                                    local_60 = pIVar9;
                                                    Memory::RecyclerWriteBarrierManager::
                                                    WriteBarrier(&local_60);
                                                    uVar12 = FunctionBody::GetCountField
                                                                       (this_01,LoopCount);
                                                    bVar11 = BufferWriter::
                                                             WriteArray<Js::ImplicitCallFlags>
                                                                       (writer,local_60,
                                                                        (ulong)uVar12);
                                                    if ((((bVar11) &&
                                                         (bVar11 = BufferWriter::
                                                                                                                                      
                                                  WriteArray<Js::ImplicitCallFlags_const>
                                                            (writer,&this->implicitCallFlags,1),
                                                  bVar11)) &&
                                                  (bVar11 = BufferWriter::
                                                            WriteArray<Js::ThisInfo_const>
                                                                      (writer,&this->thisInfo,1),
                                                  bVar11)) &&
                                                  ((bVar11 = BufferWriter::
                                                                                                                          
                                                  WriteArray<Js::DynamicProfileInfo::Bits_const>
                                                            (writer,&this->bits,1), bVar11 &&
                                                  (bVar11 = BufferWriter::
                                                            WriteArray<unsigned_int_const>
                                                                      (writer,&this->
                                                  m_recursiveInlineInfo,1), bVar11)))) {
                                                    this_00 = (this->loopFlags).ptr;
                                                    if (this_00 != (BVFixed *)0x0) {
                                                      BVar13 = BVFixed::WordCount(this_00);
                                                      bVar11 = BufferWriter::
                                                               WriteArray<BVUnitT<unsigned_long>>
                                                                         (writer,(
                                                  BVUnitT<unsigned_long> *)(this_00 + 1),
                                                  (ulong)BVar13);
                                                  return bVar11;
                                                  }
                                                  return true;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool DynamicProfileInfo::Serialize(T * writer)
    {
#if DBG_DUMP
        writer->Log(this);
#endif
        FunctionBody * functionBody = this->GetFunctionBody();
        Js::ArgSlot paramInfoCount = functionBody->GetProfiledInParamsCount();
        if (!writer->Write(functionBody->GetLocalFunctionId())
            || !writer->Write(paramInfoCount)
            || !writer->WriteArray(this->parameterInfo, paramInfoCount)
            || !writer->Write(functionBody->GetProfiledLdLenCount())
            || !writer->WriteArray(this->ldLenInfo, functionBody->GetProfiledLdLenCount())
            || !writer->Write(functionBody->GetProfiledLdElemCount())
            || !writer->WriteArray(this->ldElemInfo, functionBody->GetProfiledLdElemCount())
            || !writer->Write(functionBody->GetProfiledStElemCount())
            || !writer->WriteArray(this->stElemInfo, functionBody->GetProfiledStElemCount())
            || !writer->Write(functionBody->GetProfiledArrayCallSiteCount())
            || !writer->WriteArray(this->arrayCallSiteInfo, functionBody->GetProfiledArrayCallSiteCount())
            || !writer->Write(functionBody->GetProfiledFldCount())
            || !writer->WriteArray(this->fldInfo, functionBody->GetProfiledFldCount())
            || !writer->Write(functionBody->GetProfiledSlotCount())
            || !writer->WriteArray(this->slotInfo, functionBody->GetProfiledSlotCount())
            || !writer->Write(functionBody->GetProfiledCallSiteCount())
            || !writer->WriteArray(this->callSiteInfo, functionBody->GetProfiledCallSiteCount())
            || !writer->Write(functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->WriteArray(this->callApplyTargetInfo, functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->Write(functionBody->GetProfiledDivOrRemCount())
            || !writer->WriteArray(this->divideTypeInfo, functionBody->GetProfiledDivOrRemCount())
            || !writer->Write(functionBody->GetProfiledSwitchCount())
            || !writer->WriteArray(this->switchTypeInfo, functionBody->GetProfiledSwitchCount())
            || !writer->Write(functionBody->GetProfiledReturnTypeCount())
            || !writer->WriteArray(this->returnTypeInfo, functionBody->GetProfiledReturnTypeCount())
            || !writer->Write(functionBody->GetLoopCount())
            || !writer->WriteArray(this->loopImplicitCallFlags, functionBody->GetLoopCount())
            || !writer->Write(this->implicitCallFlags)
            || !writer->Write(this->thisInfo)
            || !writer->Write(this->bits)
            || !writer->Write(this->m_recursiveInlineInfo)
            || (this->loopFlags && !writer->WriteArray(this->loopFlags->GetData(), this->loopFlags->WordCount())))
        {
            return false;
        }
        return true;
    }